

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

int linenoiseEdit(int stdin_fd,int stdout_fd,char *buf,size_t buflen,char *prompt)

{
  char cVar1;
  linenoiseHintsCallback *plVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  int aux;
  linenoiseHintsCallback *hc;
  int local_90;
  char seq [3];
  int nread;
  int iStack_84;
  char c;
  linenoiseState l;
  char *prompt_local;
  size_t buflen_local;
  char *buf_local;
  int stdout_fd_local;
  int stdin_fd_local;
  
  nread = stdin_fd;
  iStack_84 = stdout_fd;
  l._0_8_ = buf;
  l.buf = (char *)buflen;
  l.buflen = (size_t)prompt;
  l._80_8_ = prompt;
  l.prompt = (char *)strlen(prompt);
  l.plen = 0;
  l.pos = 0;
  l.oldpos = 0;
  iVar3 = getColumns(stdin_fd,stdout_fd);
  l.len = (size_t)iVar3;
  l.cols = 0;
  l.maxrows._0_4_ = 0;
  *(undefined1 *)l._0_8_ = 0;
  l.buf = l.buf + -1;
  linenoiseHistoryAdd("");
  sVar4 = write(iStack_84,(void *)l._80_8_,(size_t)l.prompt);
  if (sVar4 != -1) {
LAB_001031d9:
    do {
      sVar4 = read(nread,seq + 2,1);
      local_90 = (int)sVar4;
      if (local_90 < 1) {
        return (int)l.oldpos;
      }
      if ((seq[2] == '\t') && (completionCallback != (linenoiseCompletionCallback *)0x0)) {
        iVar3 = completeLine((linenoiseState *)&nread);
        seq[2] = (char)iVar3;
        if (seq[2] < '\0') {
          return (int)l.oldpos;
        }
        if (seq[2] == '\0') goto LAB_001031d9;
      }
      switch(seq[2]) {
      case '\x01':
        linenoiseEditMoveHome((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\x02':
        linenoiseEditMoveLeft((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\x03':
        piVar5 = __errno_location();
        *piVar5 = 0xb;
        return -1;
      case '\x04':
        if (l.oldpos == 0) {
          history_len = history_len + -1;
          free(history[history_len]);
          return -1;
        }
        linenoiseEditDelete((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\x05':
        linenoiseEditMoveEnd((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\x06':
        linenoiseEditMoveRight((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\b':
      case '\x7f':
        linenoiseEditBackspace((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\v':
        buf[l.plen] = '\0';
        l.oldpos = l.plen;
        refreshLine((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\f':
        linenoiseClearScreen();
        refreshLine((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\r':
        history_len = history_len + -1;
        free(history[history_len]);
        if (mlmode != 0) {
          linenoiseEditMoveEnd((linenoiseState *)&nread);
        }
        plVar2 = hintsCallback;
        if (hintsCallback != (linenoiseHintsCallback *)0x0) {
          hintsCallback = (linenoiseHintsCallback *)0x0;
          refreshLine((linenoiseState *)&nread);
        }
        hintsCallback = plVar2;
        return (int)l.oldpos;
      case '\x0e':
        linenoiseEditHistoryNext((linenoiseState *)&nread,0);
        goto LAB_001031d9;
      case '\x10':
        linenoiseEditHistoryNext((linenoiseState *)&nread,1);
        goto LAB_001031d9;
      case '\x14':
        if ((l.plen != 0) && (l.plen < l.oldpos)) {
          cVar1 = buf[l.plen - 1];
          buf[l.plen - 1] = buf[l.plen];
          buf[l.plen] = cVar1;
          if (l.plen != l.oldpos - 1) {
            l.plen = l.plen + 1;
          }
          refreshLine((linenoiseState *)&nread);
        }
        goto LAB_001031d9;
      case '\x15':
        *buf = '\0';
        l.oldpos = 0;
        l.plen = 0;
        refreshLine((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\x17':
        linenoiseEditDeletePrevWord((linenoiseState *)&nread);
        goto LAB_001031d9;
      case '\x1b':
        sVar4 = read(nread,(void *)((long)&hc + 5),1);
        if ((sVar4 != -1) && (sVar4 = read(nread,(void *)((long)&hc + 6),1), sVar4 != -1)) {
          if (hc._5_1_ == '[') {
            if ((hc._6_1_ < '0') || ('9' < hc._6_1_)) {
              switch(hc._6_1_) {
              case 'A':
                linenoiseEditHistoryNext((linenoiseState *)&nread,1);
                break;
              case 'B':
                linenoiseEditHistoryNext((linenoiseState *)&nread,0);
                break;
              case 'C':
                linenoiseEditMoveRight((linenoiseState *)&nread);
                break;
              case 'D':
                linenoiseEditMoveLeft((linenoiseState *)&nread);
                break;
              case 'F':
                linenoiseEditMoveEnd((linenoiseState *)&nread);
                break;
              case 'H':
                linenoiseEditMoveHome((linenoiseState *)&nread);
              }
            }
            else {
              sVar4 = read(nread,(void *)((long)&hc + 7),1);
              if (((sVar4 != -1) && (hc._7_1_ == '~')) && (hc._6_1_ == '3')) {
                linenoiseEditDelete((linenoiseState *)&nread);
              }
            }
          }
          else if (hc._5_1_ == 'O') {
            if (hc._6_1_ == 'F') {
              linenoiseEditMoveEnd((linenoiseState *)&nread);
            }
            else if (hc._6_1_ == 'H') {
              linenoiseEditMoveHome((linenoiseState *)&nread);
            }
          }
        }
        goto LAB_001031d9;
      }
      iVar3 = linenoiseEditInsert((linenoiseState *)&nread,seq[2]);
    } while (iVar3 == 0);
  }
  return -1;
}

Assistant:

static int linenoiseEdit(int stdin_fd, int stdout_fd, char *buf, size_t buflen, const char *prompt)
{
    struct linenoiseState l;

    /* Populate the linenoise state that we pass to functions implementing
     * specific editing functionalities. */
    l.ifd = stdin_fd;
    l.ofd = stdout_fd;
    l.buf = buf;
    l.buflen = buflen;
    l.prompt = prompt;
    l.plen = strlen(prompt);
    l.oldpos = l.pos = 0;
    l.len = 0;
    l.cols = getColumns(stdin_fd, stdout_fd);
    l.maxrows = 0;
    l.history_index = 0;

    /* Buffer starts empty. */
    l.buf[0] = '\0';
    l.buflen--; /* Make sure there is always space for the nulterm */

    /* The latest history entry is always our current buffer, that
     * initially is just an empty string. */
    linenoiseHistoryAdd("");

    if (write(l.ofd,prompt,l.plen) == -1) return -1;
    while(1) {
        char c;
        int nread;
        char seq[3];

        nread = read(l.ifd,&c,1);
        if (nread <= 0) return l.len;

        /* Only autocomplete when the callback is set. It returns < 0 when
         * there was an error reading from fd. Otherwise it will return the
         * character that should be handled next. */
        if (c == 9 && completionCallback != NULL) {
            c = completeLine(&l);
            /* Return on errors */
            if (c < 0) return l.len;
            /* Read next character when 0 */
            if (c == 0) continue;
        }

        switch(c) {
        case ENTER:    /* enter */
            history_len--;
            free(history[history_len]);
            if (mlmode) linenoiseEditMoveEnd(&l);
            if (hintsCallback) {
                /* Force a refresh without hints to leave the previous
                 * line as the user typed it after a newline. */
                linenoiseHintsCallback *hc = hintsCallback;
                hintsCallback = NULL;
                refreshLine(&l);
                hintsCallback = hc;
            }
            return (int)l.len;
        case CTRL_C:     /* ctrl-c */
            errno = EAGAIN;
            return -1;
        case BACKSPACE:   /* backspace */
        case 8:     /* ctrl-h */
            linenoiseEditBackspace(&l);
            break;
        case CTRL_D:     /* ctrl-d, remove char at right of cursor, or if the
                            line is empty, act as end-of-file. */
            if (l.len > 0) {
                linenoiseEditDelete(&l);
            } else {
                history_len--;
                free(history[history_len]);
                return -1;
            }
            break;
        case CTRL_T:    /* ctrl-t, swaps current character with previous. */
            if (l.pos > 0 && l.pos < l.len) {
                int aux = buf[l.pos-1];
                buf[l.pos-1] = buf[l.pos];
                buf[l.pos] = aux;
                if (l.pos != l.len-1) l.pos++;
                refreshLine(&l);
            }
            break;
        case CTRL_B:     /* ctrl-b */
            linenoiseEditMoveLeft(&l);
            break;
        case CTRL_F:     /* ctrl-f */
            linenoiseEditMoveRight(&l);
            break;
        case CTRL_P:    /* ctrl-p */
            linenoiseEditHistoryNext(&l, LINENOISE_HISTORY_PREV);
            break;
        case CTRL_N:    /* ctrl-n */
            linenoiseEditHistoryNext(&l, LINENOISE_HISTORY_NEXT);
            break;
        case ESC:    /* escape sequence */
            /* Read the next two bytes representing the escape sequence.
             * Use two calls to handle slow terminals returning the two
             * chars at different times. */
            if (read(l.ifd,seq,1) == -1) break;
            if (read(l.ifd,seq+1,1) == -1) break;

            /* ESC [ sequences. */
            if (seq[0] == '[') {
                if (seq[1] >= '0' && seq[1] <= '9') {
                    /* Extended escape, read additional byte. */
                    if (read(l.ifd,seq+2,1) == -1) break;
                    if (seq[2] == '~') {
                        switch(seq[1]) {
                        case '3': /* Delete key. */
                            linenoiseEditDelete(&l);
                            break;
                        }
                    }
                } else {
                    switch(seq[1]) {
                    case 'A': /* Up */
                        linenoiseEditHistoryNext(&l, LINENOISE_HISTORY_PREV);
                        break;
                    case 'B': /* Down */
                        linenoiseEditHistoryNext(&l, LINENOISE_HISTORY_NEXT);
                        break;
                    case 'C': /* Right */
                        linenoiseEditMoveRight(&l);
                        break;
                    case 'D': /* Left */
                        linenoiseEditMoveLeft(&l);
                        break;
                    case 'H': /* Home */
                        linenoiseEditMoveHome(&l);
                        break;
                    case 'F': /* End*/
                        linenoiseEditMoveEnd(&l);
                        break;
                    }
                }
            }

            /* ESC O sequences. */
            else if (seq[0] == 'O') {
                switch(seq[1]) {
                case 'H': /* Home */
                    linenoiseEditMoveHome(&l);
                    break;
                case 'F': /* End*/
                    linenoiseEditMoveEnd(&l);
                    break;
                }
            }
            break;
        default:
            if (linenoiseEditInsert(&l,c)) return -1;
            break;
        case CTRL_U: /* Ctrl+u, delete the whole line. */
            buf[0] = '\0';
            l.pos = l.len = 0;
            refreshLine(&l);
            break;
        case CTRL_K: /* Ctrl+k, delete from current to end of line. */
            buf[l.pos] = '\0';
            l.len = l.pos;
            refreshLine(&l);
            break;
        case CTRL_A: /* Ctrl+a, go to the start of the line */
            linenoiseEditMoveHome(&l);
            break;
        case CTRL_E: /* ctrl+e, go to the end of the line */
            linenoiseEditMoveEnd(&l);
            break;
        case CTRL_L: /* ctrl+l, clear screen */
            linenoiseClearScreen();
            refreshLine(&l);
            break;
        case CTRL_W: /* ctrl+w, delete previous word */
            linenoiseEditDeletePrevWord(&l);
            break;
        }
    }
    return l.len;
}